

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_operator_caching_verifier.cpp
# Opt level: O2

unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
__thiscall
duckdb::NoOperatorCachingVerifier::Create
          (NoOperatorCachingVerifier *this,SQLStatement *statement_p,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          parameters)

{
  _func_int **pp_Var1;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_30;
  _func_int **local_28;
  optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
  local_20;
  
  local_20.ptr = parameters.ptr;
  (*statement_p->_vptr_SQLStatement[3])(&local_30);
  make_uniq<duckdb::NoOperatorCachingVerifier,duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,duckdb::optional_ptr<std::unordered_map<std::__cxx11::string,duckdb::BoundParameterData,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>>>,true>&>
            ((duckdb *)&local_28,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             &local_30,&local_20);
  pp_Var1 = local_28;
  local_28 = (_func_int **)0x0;
  (this->super_StatementVerifier)._vptr_StatementVerifier = pp_Var1;
  if (local_30._M_head_impl != (SQLStatement *)0x0) {
    (*(local_30._M_head_impl)->_vptr_SQLStatement[1])();
  }
  return (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         this;
}

Assistant:

unique_ptr<StatementVerifier>
NoOperatorCachingVerifier::Create(const SQLStatement &statement_p,
                                  optional_ptr<case_insensitive_map_t<BoundParameterData>> parameters) {
	return make_uniq<NoOperatorCachingVerifier>(statement_p.Copy(), parameters);
}